

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapCmpCallback1(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  sxi32 sVar1;
  int in_ECX;
  jx9_value sB;
  jx9_value sA;
  jx9_value local_b0;
  jx9_value local_70;
  
  if (pCmpData != (void *)0x0) {
    jx9MemObjInit(pA->pMap->pVm,&local_70);
    jx9MemObjInit(pA->pMap->pVm,&local_b0);
    jx9HashmapExtractNodeValue(pA,&local_70,0);
    jx9HashmapExtractNodeValue(pB,&local_b0,0);
    if ((int)pCmpData == 5) {
      if (((byte)local_70.iFlags & 1) == 0) {
        jx9MemObjToString(&local_70);
      }
      if (((byte)local_b0.iFlags & 1) == 0) {
        jx9MemObjToString(&local_b0);
      }
    }
    else {
      jx9MemObjToNumeric(&local_70);
      jx9MemObjToNumeric(&local_b0);
    }
    sVar1 = jx9MemObjCmp(&local_70,&local_b0,0,in_ECX);
    jx9MemObjRelease(&local_70);
    jx9MemObjRelease(&local_b0);
    return sVar1;
  }
  sVar1 = HashmapNodeCmp(pA,pB,0);
  return sVar1;
}

Assistant:

static sxi32 HashmapCmpCallback1(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sA, sB;
	sxi32 iFlags;
	int rc;
	if( pCmpData == 0 ){
		/* Perform a standard comparison */
		rc = HashmapNodeCmp(pA, pB, FALSE);
		return rc;
	}
	iFlags = SX_PTR_TO_INT(pCmpData);
	/* Duplicate node values */
	jx9MemObjInit(pA->pMap->pVm, &sA);
	jx9MemObjInit(pA->pMap->pVm, &sB);
	jx9HashmapExtractNodeValue(pA, &sA, FALSE);
	jx9HashmapExtractNodeValue(pB, &sB, FALSE);
	if( iFlags == 5 ){
		/* String cast */
		if( (sA.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sA);
		}
		if( (sB.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sB);
		}
	}else{
		/* Numeric cast */
		jx9MemObjToNumeric(&sA);
		jx9MemObjToNumeric(&sB);
	}
	/* Perform the comparison */
	rc = jx9MemObjCmp(&sA, &sB, FALSE, 0);
	jx9MemObjRelease(&sA);
	jx9MemObjRelease(&sB);
	return rc;
}